

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask14_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar2 = in[1] << 0xe | uVar2;
  *out = uVar2;
  uVar1 = in[2];
  *out = uVar1 << 0x1c | uVar2;
  uVar1 = uVar1 >> 4;
  out[1] = uVar1;
  uVar1 = in[3] << 10 | uVar1;
  out[1] = uVar1;
  uVar2 = in[4];
  out[1] = uVar2 << 0x18 | uVar1;
  uVar2 = uVar2 >> 8;
  out[2] = uVar2;
  uVar2 = in[5] << 6 | uVar2;
  out[2] = uVar2;
  uVar1 = in[6];
  out[2] = uVar1 << 0x14 | uVar2;
  uVar1 = uVar1 >> 0xc;
  out[3] = uVar1;
  uVar1 = in[7] << 2 | uVar1;
  out[3] = uVar1;
  uVar1 = in[8] << 0x10 | uVar1;
  out[3] = uVar1;
  uVar2 = in[9];
  out[3] = uVar2 << 0x1e | uVar1;
  uVar2 = uVar2 >> 2;
  out[4] = uVar2;
  uVar2 = in[10] << 0xc | uVar2;
  out[4] = uVar2;
  uVar1 = in[0xb];
  out[4] = uVar1 << 0x1a | uVar2;
  uVar1 = uVar1 >> 6;
  out[5] = uVar1;
  uVar1 = in[0xc] << 8 | uVar1;
  out[5] = uVar1;
  uVar2 = in[0xd];
  out[5] = uVar2 << 0x16 | uVar1;
  uVar2 = uVar2 >> 10;
  out[6] = uVar2;
  uVar2 = in[0xe] << 4 | uVar2;
  out[6] = uVar2;
  out[6] = in[0xf] << 0x12 | uVar2;
  uVar2 = in[0x10];
  out[7] = uVar2;
  uVar2 = in[0x11] << 0xe | uVar2;
  out[7] = uVar2;
  uVar1 = in[0x12];
  out[7] = uVar1 << 0x1c | uVar2;
  uVar1 = uVar1 >> 4;
  out[8] = uVar1;
  uVar1 = in[0x13] << 10 | uVar1;
  out[8] = uVar1;
  uVar2 = in[0x14];
  out[8] = uVar2 << 0x18 | uVar1;
  uVar2 = uVar2 >> 8;
  out[9] = uVar2;
  uVar2 = in[0x15] << 6 | uVar2;
  out[9] = uVar2;
  uVar1 = in[0x16];
  out[9] = uVar1 << 0x14 | uVar2;
  uVar1 = uVar1 >> 0xc;
  out[10] = uVar1;
  out[10] = in[0x17] << 2 | uVar1;
  return out + 0xb;
}

Assistant:

uint32_t *__fastpackwithoutmask14_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (14 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (14 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (14 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (14 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (14 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (14 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (14 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (14 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (14 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;

  return out + 1;
}